

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_is_coinbase(wally_tx *tx,size_t *written)

{
  wally_tx_input *pwVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = -2;
  if (written != (size_t *)0x0 && tx != (wally_tx *)0x0) {
    iVar3 = 0;
    if ((((tx->num_inputs == 1) && (pwVar1 = tx->inputs, pwVar1 != (wally_tx_input *)0x0)) &&
        (pwVar1->index == 0xffffffff)) && (pwVar1->txhash[0] == '\0')) {
      uVar4 = 0xffffffffffffffff;
      do {
        if (uVar4 == 0x1e) {
          uVar5 = 0x1f;
          break;
        }
        uVar5 = uVar4 + 1;
        lVar2 = uVar4 + 2;
        uVar4 = uVar5;
      } while (pwVar1->txhash[lVar2] == '\0');
      uVar4 = (ulong)(0x1e < uVar5);
    }
    else {
      uVar4 = 0;
    }
    *written = uVar4;
  }
  return iVar3;
}

Assistant:

int wally_tx_is_coinbase(const struct wally_tx *tx, size_t *written)
{
    if (!tx || !written)
        return WALLY_EINVAL;

    *written = tx->num_inputs == 1 && is_valid_coinbase_input(tx->inputs);

    return WALLY_OK;
}